

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O3

TestStatus *
vkt::geometry::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,TestParams_conflict params)

{
  void **this;
  VkImageCreateFlags *pVVar1;
  pointer pbVar2;
  pointer pbVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  TestLog *log;
  void *data;
  deUint32 layers;
  VkImageSubresourceRange subresourceRange;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  VkExtent2D VVar9;
  undefined8 obj;
  Context *pCVar10;
  undefined8 uVar11;
  undefined8 alloc;
  VkOffset2D commandBuffer;
  VkOffset2D VVar12;
  undefined8 image;
  bool bVar13;
  VkImageViewType viewType;
  deUint32 queueFamilyIndex;
  int iVar14;
  VkResult result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TextureFormat TVar17;
  const_iterator cVar18;
  ostream *this_00;
  ulong uVar19;
  NotSupportedError *this_01;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  char *pcVar24;
  TestStatus *pTVar25;
  undefined4 uVar26;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  Vec4 local_6d8;
  TestStatus *local_6c8;
  Context *local_6c0;
  VkAttachmentReference colorAttachmentRef;
  void *local_6b0;
  VkPipelineColorBlendStateCreateFlags VStack_6a8;
  VkBool32 VStack_6a4;
  VkLogicOp VStack_6a0;
  deUint32 dStack_69c;
  VkPipelineColorBlendAttachmentState *local_698;
  float local_690 [4];
  ConstPixelBufferAccess layerImage;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_650;
  VkImageCreateInfo imageParams;
  deUint64 local_5c0;
  char *local_5b8;
  undefined8 local_5b0;
  VkRect2D scissor;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_490;
  TextureFormat local_478;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_470;
  Vec4 local_458;
  VkQueue local_440;
  VkViewport res_1;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_3f0;
  VkPipelineLayout local_3d8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_3d0;
  VkFramebuffer local_3b8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_3b0;
  VkShaderModule local_398;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_390;
  VkShaderModule local_378;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_370;
  VkShaderModule local_358;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_350;
  VkImageView local_338;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_330;
  undefined1 local_318 [16];
  undefined8 local_308;
  PFN_vkFreeFunction p_Stack_300;
  float local_2f8 [4];
  undefined8 local_2e8;
  float local_2e0 [4];
  undefined8 local_2d0;
  VkCompareOp local_2c8;
  float local_2c4 [4];
  float local_2b4;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  undefined1 local_1b8 [32];
  VkPipelineVertexInputStateCreateInfo *local_198;
  VkImageCreateInfo *local_190;
  VkPipelineTessellationStateCreateInfo *local_188;
  VkPipelineViewportStateCreateInfo *local_180;
  VkPipelineRasterizationStateCreateInfo *local_178;
  VkPipelineMultisampleStateCreateInfo *local_170;
  VkPipelineDepthStencilStateCreateInfo *local_168;
  VkPipelineColorBlendStateCreateInfo *local_160;
  VkPipelineDynamicStateCreateInfo *local_158;
  VkPipelineLayout local_150;
  VkRenderPass local_148;
  deUint32 local_140;
  VkPipeline local_138;
  deInt32 local_130;
  VkClearValue clearValue;
  
  uVar21 = 0;
  viewType = params.image.viewType;
  local_6c8 = __return_storage_ptr__;
  if ((ulong)params.image.viewType == 2) {
    pvVar15 = Context::getDeviceExtensions_abi_cxx11_(context);
    pbVar2 = (pvVar15->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar15 = Context::getDeviceExtensions_abi_cxx11_(context);
    pbVar3 = (pvVar15->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    _Var16 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                       (pbVar2,pbVar3,"VK_KHR_maintenance1");
    if (_Var16._M_current == pbVar3) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                 ,0x381);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar21 = 0x20;
    viewType = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
  }
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_440 = Context::getUniversalQueue(context);
  local_6c0 = context;
  allocator = Context::getDefaultAllocator(context);
  checkGeometryShaderSupport(vki,physDevice,0);
  layers = params.image.numLayers;
  if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
    layers = params.image.size.depth;
  }
  TVar17 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar14 = tcu::getPixelSize(TVar17);
  imageParams.flags =
       (uint)(params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY ||
             params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE) << 4 | uVar21;
  imageParams.imageType = VK_IMAGE_TYPE_LAST;
  if (params.image.viewType < VK_IMAGE_VIEW_TYPE_LAST) {
    imageParams.imageType = *(VkImageType *)(&DAT_00b44904 + (ulong)params.image.viewType * 4);
  }
  VVar9 = params.image.size._0_8_;
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.format = VK_FORMAT_R8G8B8A8_UNORM;
  imageParams.extent.depth = params.image.size.depth;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = params.image.numLayers;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams._64_8_ = imageParams._64_8_ & 0xffffffff00000000;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = imageParams._80_8_ & 0xffffffff00000000;
  imageParams.extent.width = params.image.size.width;
  imageParams.extent.height = params.image.size.height;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_1b8,vk,device,&imageParams,
                    (VkAllocationCallbacks *)0x0);
  image = local_1b8._0_8_;
  DStack_650.m_deviceIface = (DeviceInterface *)local_1b8._8_8_;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
            allocator,(VkImage)local_1b8._0_8_,(MemoryRequirement)0x0);
  uVar11 = imageParams._0_8_;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = layers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&imageParams,vk,device,(VkImage)image,
                viewType,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  pCVar10 = local_6c0;
  uVar19 = (ulong)(params.image.numLayers * params.image.size.depth * params.image.size.width *
                   params.image.size.height * iVar14);
  DStack_330.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_330.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_338.m_internal = imageParams._0_8_;
  DStack_330.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  makeBufferCreateInfo((VkBufferCreateInfo *)&imageParams,uVar19,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1b8,vk,device,
                     (VkBufferCreateInfo *)&imageParams,(VkAllocationCallbacks *)0x0);
  local_478.order = local_1b8._0_4_;
  local_478.type = local_1b8._4_4_;
  DStack_470.m_deviceIface = (DeviceInterface *)local_1b8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
             allocator,(VkBuffer)local_1b8._0_8_,(MemoryRequirement)0x1);
  alloc = imageParams._0_8_;
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar10->m_progCollection;
  TVar17 = (TextureFormat)((long)local_1b8 + 0x10);
  local_1b8._0_8_ = TVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"vert","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar18._M_node + 2),0);
  DStack_350.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_350.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_358.m_internal = imageParams._0_8_;
  DStack_350.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((TextureFormat)local_1b8._0_8_ != TVar17) {
    operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
  }
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar10->m_progCollection;
  local_1b8._0_8_ = TVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"geom","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar18._M_node + 2),0);
  DStack_370.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_370.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_378.m_internal = imageParams._0_8_;
  DStack_370.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((TextureFormat)local_1b8._0_8_ != TVar17) {
    operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
  }
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar10->m_progCollection;
  local_1b8._0_8_ = TVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"frag","");
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_1b8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,
             *(ProgramBinary **)(cVar18._M_node + 2),0);
  DStack_390.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_390.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_398.m_internal = imageParams._0_8_;
  DStack_390.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  if ((TextureFormat)local_1b8._0_8_ != TVar17) {
    operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
  }
  local_1b8._24_8_ = local_318;
  local_318._0_8_ = (void *)0x2500000000;
  local_308 = 0x200000000;
  local_318._8_8_ = 0x100000001;
  p_Stack_300 = (PFN_vkFreeFunction)&DAT_00000001;
  local_2f8[0] = 2.8026e-45;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_1b8._0_4_ = 0x26;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  local_1b8._16_4_ = 0;
  local_1b8._20_4_ = 1;
  local_198 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_198._4_4_,1);
  local_188 = (VkPipelineTessellationStateCreateInfo *)((ulong)local_188 & 0xffffffff00000000);
  local_180 = (VkPipelineViewportStateCreateInfo *)0x0;
  local_190 = &imageParams;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,vk,device,
             (VkRenderPassCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  obj = pipelineRasterizationStateInfo._0_8_;
  DStack_490.m_deviceIface = (DeviceInterface *)pipelineRasterizationStateInfo.pNext;
  DStack_490.m_device = (VkDevice)pipelineRasterizationStateInfo._16_8_;
  DStack_490.m_allocator = (VkAllocationCallbacks *)pipelineRasterizationStateInfo._24_8_;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&imageParams,vk,device,
                  (VkRenderPass)pipelineRasterizationStateInfo._0_8_,local_338,
                  params.image.size.width,params.image.size.height,layers);
  DStack_3b0.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_3b0.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_3b8.m_internal = imageParams._0_8_;
  DStack_3b0.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&imageParams,vk,device,
                     (VkDescriptorSetLayout)0x0);
  DStack_3d0.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  local_3d8.m_internal = imageParams._0_8_;
  DStack_3d0.m_device = (VkDevice)CONCAT44(imageParams.imageType,imageParams.flags);
  DStack_3d0.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  pipelineViewportStateInfo.pViewports = &res_1;
  res_1.x = 0.0;
  res_1.y = 0.0;
  pipelineRasterizationStateInfo._16_16_ = ZEXT416(0);
  res_1.height = (float)((ulong)VVar9 >> 0x20);
  res_1.width = (float)((ulong)VVar9 & 0xffffffff);
  res_1.minDepth = 0.0;
  res_1.maxDepth = 1.0;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  local_180 = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  pipelineRasterizationStateInfo._0_16_ = ZEXT416(0x17);
  local_170 = &pipelineMultisampleStateInfo;
  pipelineMultisampleStateInfo._0_16_ = ZEXT416(0x18);
  pipelineMultisampleStateInfo._16_16_ = ZEXT816(0x100000000);
  local_318._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  p_Stack_300 = (PFN_vkFreeFunction)0x100000000;
  local_2e8._0_4_ = VK_STENCIL_OP_KEEP;
  local_2e8._4_4_ = VK_COMPARE_OP_ALWAYS;
  local_6b0 = (void *)0x0;
  pipelineRasterizationStateInfo._48_12_ = ZEXT412(0x3f800000) << 0x40;
  pipelineRasterizationStateInfo._60_4_ = 0;
  local_2d0._0_4_ = VK_STENCIL_OP_KEEP;
  local_2d0._4_4_ = VK_STENCIL_OP_KEEP;
  local_2c8 = VK_COMPARE_OP_ALWAYS;
  local_2b4 = 1.0;
  colorAttachmentRef.attachment = 0x1a;
  VStack_6a8 = 0;
  VStack_6a4 = 0;
  VStack_6a0 = VK_LOGIC_OP_COPY;
  dStack_69c = 1;
  local_698 = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  imageParams.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = (VkFormat)local_358.m_internal;
  imageParams.extent.width = (deUint32)(local_358.m_internal >> 0x20);
  imageParams.extent.height = 0xac0965;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 8;
  imageParams.pQueueFamilyIndices = (deUint32 *)local_378.m_internal;
  imageParams._80_8_ = (long)"pre_main" + 4;
  local_5c0 = local_398.m_internal;
  local_5b8 = "main";
  local_1b8._0_4_ = sBGR|sR;
  local_1b8._8_8_ = (DeviceInterface *)0x0;
  local_1b8._16_4_ = 0;
  local_1b8._20_4_ = 3;
  local_198 = &vertexInputStateInfo;
  vertexInputStateInfo._0_16_ = ZEXT416(0x13);
  local_190 = (VkImageCreateInfo *)&pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  local_188 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_178 = &pipelineRasterizationStateInfo;
  local_168 = (VkPipelineDepthStencilStateCreateInfo *)local_318;
  local_160 = (VkPipelineColorBlendStateCreateInfo *)&colorAttachmentRef;
  local_158 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_150.m_internal = local_3d8.m_internal;
  local_148.m_internal = obj;
  local_5b0 = 0;
  local_140 = 0;
  local_138.m_internal = 0;
  local_130 = 0;
  pipelineRasterizationStateInfo._32_16_ = pipelineRasterizationStateInfo._16_16_;
  local_690 = (float  [4])pipelineRasterizationStateInfo._16_16_;
  scissor.extent = VVar9;
  unique0x10002185 = (float  [4])pipelineRasterizationStateInfo._16_16_;
  local_2f8 = (float  [4])pipelineRasterizationStateInfo._16_16_;
  local_2e0 = (float  [4])pipelineRasterizationStateInfo._16_16_;
  local_2c4 = (float  [4])pipelineRasterizationStateInfo._16_16_;
  pipelineMultisampleStateInfo._32_16_ = pipelineRasterizationStateInfo._16_16_;
  vertexInputStateInfo._16_16_ = pipelineRasterizationStateInfo._16_16_;
  vertexInputStateInfo._32_16_ = pipelineRasterizationStateInfo._16_16_;
  local_1b8._24_8_ = &imageParams;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&layerImage,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  TVar17 = layerImage.m_format;
  DStack_3f0.m_deviceIface = (DeviceInterface *)layerImage.m_size.m_data._0_8_;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&imageParams,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  res_1.maxDepth = (float)imageParams.imageType;
  res_1.minDepth = (float)imageParams.flags;
  res_1.x = (float)imageParams.sType;
  res_1.y = (float)imageParams._4_4_;
  res_1._8_8_ = imageParams.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&imageParams,vk,device,
             (VkCommandPool)imageParams._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar5 = CONCAT44(imageParams.imageType,imageParams.flags);
  uVar6 = CONCAT44(imageParams.extent.width,imageParams.format);
  scissor.offset.x = imageParams.sType;
  scissor.offset.y = imageParams._4_4_;
  scissor.extent = (VkExtent2D)imageParams.pNext;
  zeroBuffer(vk,device,(Allocation *)alloc,uVar19);
  commandBuffer = scissor.offset;
  beginCommandBuffer(vk,(VkCommandBuffer)scissor.offset);
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0x3f80000000000000;
  local_318._0_4_ = 0x2b;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = obj;
  stack0xfffffffffffffcf0 = (float  [4])(auVar7 << 0x40);
  p_Stack_300 = (PFN_vkFreeFunction)local_3b8.m_internal;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = VVar9.width;
  auVar8._4_4_ = VVar9.height;
  local_2f8 = (float  [4])(auVar8 << 0x40);
  local_2e8._0_4_ = VK_STENCIL_OP_ZERO;
  local_2e0._0_8_ = &clearValue;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_318,0);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,TVar17);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  imageParams.mipLevels = (deUint32)image;
  imageParams.arrayLayers = SUB84(image,4);
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 1;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = params.image.numLayers;
  uVar26 = SUB84(&imageParams,0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar26);
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = params.image.numLayers;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.tiling = params.image.size.depth;
  imageParams.arrayLayers = params.image.size.width;
  imageParams.samples = params.image.size.height;
  (*vk->_vptr_DeviceInterface[99])(vk,commandBuffer,image,6,local_478,1,uVar26);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  imageParams.extent.height = local_478.order;
  imageParams.extent.depth = local_478.type;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x4000,0,0,0,1,&imageParams,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                    ,0x3fc);
  submitCommandsAndWait(vk,device,local_440,(VkCommandBuffer)commandBuffer);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(alloc + 8),*(VkDeviceSize *)(alloc + 0x10),
             uVar19);
  log = local_6c0->m_testCtx->m_log;
  data = *(void **)(alloc + 0x18);
  if ((params.image.viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY) ||
     ((params.image.viewType != VK_IMAGE_VIEW_TYPE_3D &&
      (params.image.size.depth = params.image.numLayers,
      params.image.viewType == VK_IMAGE_VIEW_TYPE_1D)))) {
    pipelineRasterizationStateInfo._4_8_ = 0x100000001;
    pipelineRasterizationStateInfo.sType = params.image.size.width;
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.numLayers;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.numLayers,1,data);
  }
  else {
    pipelineRasterizationStateInfo.pNext._0_4_ = 0;
    pipelineRasterizationStateInfo.sType = VVar9.width;
    pipelineRasterizationStateInfo._4_4_ = VVar9.height;
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.size.depth;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.size.height,
               params.image.size.depth,data);
  }
  if ((int)pipelineRasterizationStateInfo.pNext._4_4_ < 1) {
    iVar14 = 0;
  }
  else {
    this = &imageParams.pNext;
    iVar22 = 0;
    uVar21 = 0;
    iVar14 = 0;
    do {
      tcu::getSubregion(&layerImage,(ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
                        0,(uint)pipelineRasterizationStateInfo.pNext * uVar21,
                        (~(uint)pipelineRasterizationStateInfo.pNext & 1) * uVar21,
                        pipelineRasterizationStateInfo.sType,pipelineRasterizationStateInfo._4_4_,1)
      ;
      imageParams._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying ",10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
        lVar20 = 10;
        pcVar24 = "slice z = ";
LAB_009bffa0:
        this_00 = (ostream *)local_1b8;
        std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar24,lVar20);
        uVar23 = uVar21;
      }
      else {
        if ((params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) &&
           (params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE)) {
          lVar20 = 6;
          pcVar24 = "layer ";
          goto LAB_009bffa0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"cube ",5);
        this_00 = (ostream *)std::ostream::operator<<(local_1b8,uVar21 / 6);
        std::__ostream_insert<char,std::char_traits<char>>(this_00,", face ",7);
        uVar23 = uVar21 % 6;
      }
      std::ostream::operator<<(this_00,uVar23);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)&local_148);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(char *)colorAttachmentRef,(long)local_6b0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&imageParams,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (colorAttachmentRef != (VkAttachmentReference)&VStack_6a8) {
        operator_delete((void *)colorAttachmentRef,CONCAT44(VStack_6a4,VStack_6a8) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      std::ios_base::~ios_base((ios_base *)&local_5c0);
      local_458.m_data[0] = 1.0;
      local_458.m_data[1] = 1.0;
      local_458.m_data[2] = 1.0;
      local_458.m_data[3] = 1.0;
      switch(params.testType) {
      case TEST_TYPE_DEFAULT_LAYER:
        if (uVar21 == 0) {
          imageParams.sType = layerImage.m_format.order;
          imageParams._4_4_ = layerImage.m_format.type;
          imageParams.flags = layerImage.m_size.m_data[2];
          imageParams.pNext = (void *)layerImage.m_size.m_data._0_8_;
          imageParams.extent.width = layerImage.m_pitch.m_data[2];
          imageParams.imageType = layerImage.m_pitch.m_data[0];
          imageParams.format = layerImage.m_pitch.m_data[1];
          imageParams.extent.height = (deUint32)layerImage.m_data;
          imageParams.extent.depth = (deUint32)((ulong)layerImage.m_data >> 0x20);
          bVar13 = verifyImageSingleColoredRow
                             (log,(ConstPixelBufferAccess *)&imageParams,0.5,&local_458);
        }
        else {
          local_1b8._0_4_ = layerImage.m_format.order;
          local_1b8._4_4_ = layerImage.m_format.type;
          local_1b8._16_4_ = layerImage.m_size.m_data[2];
          local_1b8._8_4_ = layerImage.m_size.m_data[0];
          local_1b8._12_4_ = layerImage.m_size.m_data[1];
          local_1b8._28_4_ = layerImage.m_pitch.m_data[2];
          local_1b8._20_4_ = layerImage.m_pitch.m_data[0];
          local_1b8._24_4_ = layerImage.m_pitch.m_data[1];
          local_198 = (VkPipelineVertexInputStateCreateInfo *)layerImage.m_data;
          bVar13 = verifyEmptyImage(log,(ConstPixelBufferAccess *)local_1b8);
        }
        break;
      case TEST_TYPE_SINGLE_LAYER:
        if (uVar21 == (int)pipelineRasterizationStateInfo.pNext._4_4_ / 2) {
          colorAttachmentRef.attachment = layerImage.m_format.order;
          colorAttachmentRef.layout = layerImage.m_format.type;
          VStack_6a8 = layerImage.m_size.m_data[2];
          local_6b0 = (void *)layerImage.m_size.m_data._0_8_;
          dStack_69c = layerImage.m_pitch.m_data[2];
          VStack_6a4 = layerImage.m_pitch.m_data[0];
          VStack_6a0 = layerImage.m_pitch.m_data[1];
          local_698 = (VkPipelineColorBlendAttachmentState *)layerImage.m_data;
          bVar13 = verifyImageSingleColoredRow
                             (log,(ConstPixelBufferAccess *)&colorAttachmentRef,0.5,&local_458);
        }
        else {
          vertexInputStateInfo.pNext = (void *)layerImage.m_size.m_data._0_8_;
          vertexInputStateInfo.sType = layerImage.m_format.order;
          vertexInputStateInfo._4_4_ = layerImage.m_format.type;
          vertexInputStateInfo.pVertexBindingDescriptions._0_4_ = layerImage.m_pitch.m_data[1];
          vertexInputStateInfo.vertexBindingDescriptionCount = layerImage.m_pitch.m_data[0];
          vertexInputStateInfo.flags = layerImage.m_size.m_data[2];
          vertexInputStateInfo.pVertexBindingDescriptions._4_4_ = layerImage.m_pitch.m_data[2];
          vertexInputStateInfo._32_8_ = layerImage.m_data;
          bVar13 = verifyEmptyImage(log,(ConstPixelBufferAccess *)&vertexInputStateInfo);
        }
        break;
      case TEST_TYPE_ALL_LAYERS:
      case TEST_TYPE_INVOCATION_PER_LAYER:
        pipelineViewportStateInfo.sType = layerImage.m_format.order;
        pipelineViewportStateInfo._4_4_ = layerImage.m_format.type;
        pipelineViewportStateInfo.flags = layerImage.m_size.m_data[2];
        pipelineViewportStateInfo.pNext = (void *)layerImage.m_size.m_data._0_8_;
        pipelineViewportStateInfo.pViewports._4_4_ = layerImage.m_pitch.m_data[2];
        pipelineViewportStateInfo.viewportCount = layerImage.m_pitch.m_data[0];
        pipelineViewportStateInfo.pViewports._0_4_ = layerImage.m_pitch.m_data[1];
        pipelineViewportStateInfo._32_8_ = layerImage.m_data;
        uVar19 = (ulong)(iVar22 + (uVar21 / 6) * -0x60);
        local_6d8.m_data._0_8_ = *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + uVar19)
        ;
        local_6d8.m_data._8_8_ =
             *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + uVar19 + 8);
        bVar13 = verifyImageSingleColoredRow
                           (log,(ConstPixelBufferAccess *)&pipelineViewportStateInfo,0.5,&local_6d8)
        ;
        break;
      case TEST_TYPE_DIFFERENT_CONTENT:
      case TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION:
        if (uVar21 == 0) {
          pipelineMultisampleStateInfo.pNext = (void *)layerImage.m_size.m_data._0_8_;
          pipelineMultisampleStateInfo.sType = layerImage.m_format.order;
          pipelineMultisampleStateInfo._4_4_ = layerImage.m_format.type;
          pipelineMultisampleStateInfo.sampleShadingEnable = layerImage.m_pitch.m_data[1];
          pipelineMultisampleStateInfo.rasterizationSamples = layerImage.m_pitch.m_data[0];
          pipelineMultisampleStateInfo.flags = layerImage.m_size.m_data[2];
          pipelineMultisampleStateInfo.minSampleShading = (float)layerImage.m_pitch.m_data[2];
          pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)layerImage.m_data;
          bVar13 = verifyEmptyImage(log,(ConstPixelBufferAccess *)&pipelineMultisampleStateInfo);
        }
        else {
          pipelineInputAssemblyStateInfo.sType = layerImage.m_format.order;
          pipelineInputAssemblyStateInfo._4_4_ = layerImage.m_format.type;
          pipelineInputAssemblyStateInfo.flags = layerImage.m_size.m_data[2];
          pipelineInputAssemblyStateInfo.pNext = (void *)layerImage.m_size.m_data._0_8_;
          pipelineInputAssemblyStateInfo._28_4_ = layerImage.m_pitch.m_data[2];
          pipelineInputAssemblyStateInfo.topology = layerImage.m_pitch.m_data[0];
          pipelineInputAssemblyStateInfo.primitiveRestartEnable = layerImage.m_pitch.m_data[1];
          bVar13 = verifyImageSingleColoredRow
                             (log,(ConstPixelBufferAccess *)&pipelineInputAssemblyStateInfo,
                              (float)(int)uVar21 /
                              (float)(int)pipelineRasterizationStateInfo.pNext._4_4_,&local_458);
        }
        break;
      case TEST_TYPE_LAYER_ID:
        local_6d8.m_data[2] = 1.0;
        if (uVar21 != 0) {
          local_6d8.m_data[2] = 0.0;
        }
        uVar19 = CONCAT44(-(uint)((uVar21 & 2) == 0),-(uint)((uVar21 & 1) == 0));
        local_6d8.m_data._0_8_ = uVar19 & DAT_00a992f0 | ~uVar19 & DAT_00aa9040;
        local_6d8.m_data[3] = 1.0;
        pipelineColorBlendAttachmentState.blendEnable = layerImage.m_format.order;
        pipelineColorBlendAttachmentState.srcColorBlendFactor = layerImage.m_format.type;
        pipelineColorBlendAttachmentState.srcAlphaBlendFactor = layerImage.m_size.m_data[2];
        pipelineColorBlendAttachmentState.dstColorBlendFactor = layerImage.m_size.m_data[0];
        pipelineColorBlendAttachmentState.colorBlendOp = layerImage.m_size.m_data[1];
        pipelineColorBlendAttachmentState.colorWriteMask = layerImage.m_pitch.m_data[2];
        pipelineColorBlendAttachmentState.dstAlphaBlendFactor = layerImage.m_pitch.m_data[0];
        pipelineColorBlendAttachmentState.alphaBlendOp = layerImage.m_pitch.m_data[1];
        bVar13 = verifyImageSingleColoredRow
                           (log,(ConstPixelBufferAccess *)&pipelineColorBlendAttachmentState,0.5,
                            &local_6d8);
        break;
      default:
        goto switchD_009c00a2_default;
      }
      if (bVar13 != false) {
        iVar14 = iVar14 + 1;
      }
switchD_009c00a2_default:
      uVar21 = uVar21 + 1;
      iVar22 = iVar22 + 0x10;
    } while ((int)uVar21 < (int)pipelineRasterizationStateInfo.pNext._4_4_);
  }
  pVVar1 = &imageParams.flags;
  imageParams._0_8_ = pVVar1;
  if (iVar14 == pipelineRasterizationStateInfo.pNext._4_4_) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&imageParams,"OK","");
    pTVar25 = local_6c8;
    local_6c8->m_code = QP_TEST_RESULT_PASS;
    (local_6c8->m_description)._M_dataplus._M_p = (pointer)&(local_6c8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8->m_description,imageParams._0_8_,
               (long)imageParams.pNext + imageParams._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&imageParams,"Rendered images are incorrect","");
    pTVar25 = local_6c8;
    local_6c8->m_code = QP_TEST_RESULT_FAIL;
    (local_6c8->m_description)._M_dataplus._M_p = (pointer)&(local_6c8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8->m_description,imageParams._0_8_,
               (long)imageParams.pNext + imageParams._0_8_);
  }
  if ((VkImageCreateFlags *)imageParams._0_8_ != pVVar1) {
    operator_delete((void *)imageParams._0_8_,CONCAT44(imageParams.imageType,imageParams.flags) + 1)
    ;
  }
  VVar12 = scissor.offset;
  if (commandBuffer != (VkOffset2D)0x0) {
    scissor.offset.x = commandBuffer.x;
    scissor.offset.y = commandBuffer.y;
    imageParams.sType = scissor.offset.x;
    imageParams._4_4_ = scissor.offset.y;
    scissor.offset = VVar12;
    (**(code **)(*(long *)scissor.extent + 0x240))(scissor.extent,uVar5,uVar6,1);
  }
  if (res_1._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&res_1.width,(VkCommandPool)res_1._0_8_);
  }
  if (TVar17 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_3f0,(VkPipeline)TVar17);
  }
  if (local_3d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_3d0,local_3d8);
  }
  if (local_3b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_3b0,local_3b8);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_490,(VkRenderPass)obj);
  }
  if (local_398.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_390,local_398);
  }
  if (local_378.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_370,local_378);
  }
  if (local_358.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_350,local_358);
  }
  (**(code **)(*(long *)alloc + 8))(alloc);
  if (local_478 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_470,(VkBuffer)local_478);
  }
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_330,local_338);
  }
  if (uVar11 != 0) {
    (**(code **)(*(long *)uVar11 + 8))(uVar11);
  }
  if ((TextureFormat)image != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_650,(VkImage)image);
  }
  return pTVar25;
}

Assistant:

tcu::TestStatus test (Context& context, const TestParams params)
{
	if (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType &&
		(!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1")))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const DeviceInterface&			vk						= context.getDeviceInterface();
	const InstanceInterface&		vki						= context.getInstanceInterface();
	const VkDevice					device					= context.getDevice();
	const VkPhysicalDevice			physDevice				= context.getPhysicalDevice();
	const deUint32					queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= context.getUniversalQueue();
	Allocator&						allocator				= context.getDefaultAllocator();

	checkGeometryShaderSupport(vki, physDevice);

	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const deUint32					numLayers				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? params.image.size.depth : params.image.numLayers);
	const Vec4						clearColor				= Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize				colorBufferSize			= params.image.size.width * params.image.size.height * params.image.size.depth * params.image.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const VkImageCreateFlags		imageCreateFlags		= (isCubeImageViewType(params.image.viewType) ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlagBits)0) |
															  (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_CREATE_2D_ARRAY_COMPATIBLE_BIT_KHR : (VkImageCreateFlagBits)0);
	const VkImageViewType			viewType				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_VIEW_TYPE_2D_ARRAY : params.image.viewType);

	const Unique<VkImage>			colorImage				(makeImage				(vk, device, makeImageCreateInfo(imageCreateFlags, getImageType(params.image.viewType), colorFormat, params.image.size,
																					 params.image.numLayers, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT)));
	const UniquePtr<Allocation>		colorImageAlloc			(bindImage				(vk, device, allocator, *colorImage, MemoryRequirement::Any));
	const Unique<VkImageView>		colorAttachment			(makeImageView			(vk, device, *colorImage, viewType, colorFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));

	const Unique<VkBuffer>			colorBuffer				(makeBuffer				(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc		(bindBuffer				(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	const Unique<VkShaderModule>	vertexModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	geometryModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("geom"), 0u));
	const Unique<VkShaderModule>	fragmentModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkRenderPass>		renderPass				(makeRenderPass			(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer		(vk, device, *renderPass, *colorAttachment, params.image.size.width,  params.image.size.height, numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout			(makePipelineLayout		(vk, device));
	const Unique<VkPipeline>		pipeline				(makeGraphicsPipeline	(vk, device, *pipelineLayout, *renderPass, *vertexModule, *geometryModule, *fragmentModule,
																					 makeExtent2D(params.image.size.width, params.image.size.height)));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool		(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer	(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	beginCommandBuffer(vk, *cmdBuffer);

	const VkClearValue			clearValue	= makeClearValueColor(clearColor);
	const VkRect2D				renderArea	=
	{
		makeOffset2D(0, 0),
		makeExtent2D(params.image.size.width, params.image.size.height),
	};
	const VkRenderPassBeginInfo renderPassBeginInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		*renderPass,									// VkRenderPass            renderPass;
		*framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};
	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Prepare color image for copy
	{
		const VkImageSubresourceRange	colorSubresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, params.image.numLayers);
		const VkImageMemoryBarrier		barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
				DE_NULL,										// const void*				pNext;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			outputMask;
				VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			inputMask;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
				VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout			newLayout;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
				*colorImage,									// VkImage					image;
				colorSubresourceRange,							// VkImageSubresourceRange	subresourceRange;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
	}
	// Color image -> host buffer
	{
		const VkBufferImageCopy region =
		{
			0ull,																						// VkDeviceSize                bufferOffset;
			0u,																							// uint32_t                    bufferRowLength;
			0u,																							// uint32_t                    bufferImageHeight;
			makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, params.image.numLayers),		// VkImageSubresourceLayers    imageSubresource;
			makeOffset3D(0, 0, 0),																		// VkOffset3D                  imageOffset;
			params.image.size,																			// VkExtent3D                  imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);
	}
	// Buffer write barrier
	{
		const VkBufferMemoryBarrier barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
				DE_NULL,										// const void*        pNext;
				VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
				VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
				*colorBuffer,									// VkBuffer           buffer;
				0ull,											// VkDeviceSize       offset;
				VK_WHOLE_SIZE,									// VkDeviceSize       size;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), colorBufferSize);

	if (!verifyResults(context.getTestContext().getLog(), params, colorFormat, colorBufferAlloc->getHostPtr()))
		return tcu::TestStatus::fail("Rendered images are incorrect");
	else
		return tcu::TestStatus::pass("OK");
}